

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

void __thiscall
doctest::anon_unknown_14::ConsoleReporter::test_case_exception
          (ConsoleReporter *this,TestCaseException *e)

{
  TestCaseData *pTVar1;
  ostream *poVar2;
  int iVar3;
  pthread_mutex_t *in_RAX;
  undefined8 uVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  TestCaseData *pTVar9;
  uint uVar10;
  long lVar11;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex);
  if (iVar3 == 0) {
    if (this->tc->m_no_output == false) {
      logTestStart(this);
      pTVar1 = this->tc;
      pTVar9 = pTVar1;
      if ((pTVar1->m_file).field_0.buf[0x17] < '\0') {
        pTVar9 = (TestCaseData *)(pTVar1->m_file).field_0.data.ptr;
      }
      pcVar5 = " ";
      (*(this->super_IReporter)._vptr_IReporter[0xe])(this,pTVar9,(ulong)pTVar1->m_line);
      successOrFailColoredStringToStream(this,false,(uint)e->is_crash * 2 + is_check,pcVar5);
      poVar2 = this->s;
      Color::operator<<(poVar2,Red);
      pcVar5 = "test case THREW exception: ";
      if (e->is_crash != false) {
        pcVar5 = "test case CRASHED: ";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,pcVar5,(ulong)(e->is_crash ^ 1) * 8 + 0x13);
      Color::operator<<(poVar2,Cyan);
      doctest::operator<<(poVar2,&e->error_string);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      uVar10 = (int)(*(long *)(detail::g_cs + 0x1100) - *(long *)(detail::g_cs + 0x10f8) >> 3) *
               -0x55555555;
      if (uVar10 != 0) {
        lVar7 = *(long *)(detail::g_cs + 0x10f8);
        if (uVar10 == 0) {
          lVar7 = 0;
        }
        poVar2 = this->s;
        Color::operator<<(poVar2,None);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"  logged: ",10);
        if (0 < (int)uVar10) {
          lVar11 = (ulong)(uVar10 & 0x7fffffff) + 1;
          lVar8 = 0;
          do {
            pcVar5 = "          ";
            if (lVar8 == 0) {
              pcVar5 = "";
            }
            poVar2 = this->s;
            lVar6 = 10;
            if (lVar8 == 0) {
              lVar6 = 0;
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,lVar6);
            doctest::operator<<(poVar2,(String *)
                                       (lVar8 + lVar7 + (ulong)(uVar10 & 0x7fffffff) * 0x18 + -0x18)
                               );
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
            lVar11 = lVar11 + -1;
            lVar8 = lVar8 + -0x18;
          } while (1 < lVar11);
        }
      }
      poVar2 = this->s;
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      Color::operator<<(poVar2,None);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
    return;
  }
  uVar4 = std::__throw_system_error(iVar3);
  pthread_mutex_unlock(in_RAX);
  _Unwind_Resume(uVar4);
}

Assistant:

void test_case_exception(const TestCaseException& e) override {
            std::lock_guard<std::mutex> lock(mutex);
            if(tc->m_no_output)
                return;

            logTestStart();

            file_line_to_stream(tc->m_file.c_str(), tc->m_line, " ");
            successOrFailColoredStringToStream(false, e.is_crash ? assertType::is_require :
                                                                   assertType::is_check);
            s << Color::Red << (e.is_crash ? "test case CRASHED: " : "test case THREW exception: ")
              << Color::Cyan << e.error_string << "\n";

            int num_stringified_contexts = get_num_stringified_contexts();
            if(num_stringified_contexts) {
                auto stringified_contexts = get_stringified_contexts();
                s << Color::None << "  logged: ";
                for(int i = num_stringified_contexts; i > 0; --i) {
                    s << (i == num_stringified_contexts ? "" : "          ")
                      << stringified_contexts[i - 1] << "\n";
                }
            }
            s << "\n" << Color::None;
        }